

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void kurtosis_double_suite::test_linear_increase(void)

{
  double dVar1;
  anon_struct_8_1_6167ffdf_for_sum aVar2;
  double dVar3;
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  close_to<double> predicate_27;
  close_to<double> predicate_28;
  close_to<double> predicate_29;
  close_to<double> predicate_30;
  close_to<double> predicate_31;
  close_to<double> predicate_32;
  close_to<double> predicate_33;
  close_to<double> predicate_34;
  double *in_stack_ffffffffffffff38;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  moment_kurtosis<double> filter;
  
  filter.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.mean_factor = 0.125;
  filter.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.normalization = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.sum.mean = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.var_factor = 0.25;
  filter.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.normalization = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)3>.
  super_basic_moment<double,_(trial::online::with)2>.sum.variance = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)3>.skewness_factor = 0.25;
  filter.super_basic_moment<double,_(trial::online::with)3>.normalization = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness = 0.0;
  filter.kurtosis_factor = 0.25;
  filter.sum.kurtosis = 0.0;
  filter.normalization = 0.0;
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&filter,1.0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2ac,"void kurtosis_double_suite::test_linear_increase()",&local_b8,&local_c0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2ad,"void kurtosis_double_suite::test_linear_increase()",&local_b8,&local_c0);
  dVar1 = 0.0;
  if (0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.normalization) {
    dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                    super_basic_moment<double,_(trial::online::with)2>.normalization
                             ) &
                    (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                           filter.super_basic_moment<double,_(trial::online::with)3>.
                           super_basic_moment<double,_(trial::online::with)2>.normalization));
    if (2.220446049250313e-16 < dVar3) {
      if (dVar3 < 0.0) {
        local_b0 = filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
        uStack_a0 = 0;
        local_a8 = dVar3;
        dVar1 = sqrt(dVar3);
        aVar2.skewness = local_b0;
        dVar3 = local_a8;
      }
      else {
        dVar1 = SQRT(dVar3);
        aVar2 = filter.super_basic_moment<double,_(trial::online::with)3>.sum;
      }
      dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
              filter.super_basic_moment<double,_(trial::online::with)3>.normalization;
    }
  }
  local_c0 = 0.0;
  local_b8 = dVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2ae,"void kurtosis_double_suite::test_linear_increase()",&local_b8,&local_c0);
  local_b8 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (filter.sum.kurtosis / (dVar1 * dVar1)) / filter.normalization;
  }
  local_c0 = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2af,"void kurtosis_double_suite::test_linear_increase()",&local_b8,&local_c0);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&filter,2.0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 1.53333;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b1,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,predicate
            );
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 0.124444;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.124444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b2,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_00);
  dVar1 = 0.0;
  if ((0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_b0 = filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      uStack_a0 = 0;
      local_a8 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_b0;
      dVar3 = local_a8;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.super_basic_moment<double,_(trial::online::with)3>.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
            filter.super_basic_moment<double,_(trial::online::with)3>.normalization;
  }
  local_c0 = 1.32288;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  local_b8 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.32288","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b3,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_01);
  local_b8 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (filter.sum.kurtosis / (dVar1 * dVar1)) / filter.normalization;
  }
  local_c0 = 1.75;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b4,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_02);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&filter,3.0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 2.08876;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08876","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b6,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_03);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 0.429707;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.429707","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b7,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_04);
  dVar1 = 0.0;
  if ((0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_b0 = filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      uStack_a0 = 0;
      local_a8 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_b0;
      dVar3 = local_a8;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.super_basic_moment<double,_(trial::online::with)3>.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
            filter.super_basic_moment<double,_(trial::online::with)3>.normalization;
  }
  local_c0 = 1.27863;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  local_b8 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.27863","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b8,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_05);
  local_b8 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (filter.sum.kurtosis / (dVar1 * dVar1)) / filter.normalization;
  }
  local_c0 = 1.69807;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.69807","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b9,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_06);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&filter,4.0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 2.66608;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.66608","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2bb,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_07);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 0.923291;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.923291","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2bc,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_08);
  dVar1 = 0.0;
  if ((0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_b0 = filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      uStack_a0 = 0;
      local_a8 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_b0;
      dVar3 = local_a8;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.super_basic_moment<double,_(trial::online::with)3>.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
            filter.super_basic_moment<double,_(trial::online::with)3>.normalization;
  }
  local_c0 = 1.23592;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  local_b8 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.23592","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2bd,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_09);
  local_b8 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (filter.sum.kurtosis / (dVar1 * dVar1)) / filter.normalization;
  }
  local_c0 = 1.59157;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.59157","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2be,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_10);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&filter,5.0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 3.26502;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.26502","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c0,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_11);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 1.60733;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.60733","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c1,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_12);
  dVar1 = 0.0;
  if ((0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_b0 = filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      uStack_a0 = 0;
      local_a8 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_b0;
      dVar3 = local_a8;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.super_basic_moment<double,_(trial::online::with)3>.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
            filter.super_basic_moment<double,_(trial::online::with)3>.normalization;
  }
  local_c0 = 1.20177;
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 1e-05;
  local_b8 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.20177","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c2,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_13);
  local_b8 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (filter.sum.kurtosis / (dVar1 * dVar1)) / filter.normalization;
  }
  local_c0 = 1.50264;
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.50264","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c3,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_14);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&filter,6.0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 3.88525;
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.88525","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c5,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_15);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 2.47861;
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.47861","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c6,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_16);
  dVar1 = 0.0;
  if ((0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_b0 = filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      uStack_a0 = 0;
      local_a8 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_b0;
      dVar3 = local_a8;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.super_basic_moment<double,_(trial::online::with)3>.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
            filter.super_basic_moment<double,_(trial::online::with)3>.normalization;
  }
  local_c0 = 1.1738;
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 1e-05;
  local_b8 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.1738","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c7,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_17);
  local_b8 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (filter.sum.kurtosis / (dVar1 * dVar1)) / filter.normalization;
  }
  local_c0 = 1.42982;
  predicate_18.absolute = 2.2250738585072014e-308;
  predicate_18.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.42982","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c8,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_18);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&filter,7.0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 4.52635;
  predicate_19.absolute = 2.2250738585072014e-308;
  predicate_19.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","4.52635","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2ca,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_19);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 3.52889;
  predicate_20.absolute = 2.2250738585072014e-308;
  predicate_20.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","3.52889","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2cb,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_20);
  dVar1 = 0.0;
  if ((0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_b0 = filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      uStack_a0 = 0;
      local_a8 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_b0;
      dVar3 = local_a8;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.super_basic_moment<double,_(trial::online::with)3>.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
            filter.super_basic_moment<double,_(trial::online::with)3>.normalization;
  }
  local_c0 = 1.15036;
  predicate_21.absolute = 2.2250738585072014e-308;
  predicate_21.relative = 1e-05;
  local_b8 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.15036","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2cc,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_21);
  local_b8 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (filter.sum.kurtosis / (dVar1 * dVar1)) / filter.normalization;
  }
  local_c0 = 1.36931;
  predicate_22.absolute = 2.2250738585072014e-308;
  predicate_22.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.36931","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2cd,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_22);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&filter,8.0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 5.18786;
  predicate_23.absolute = 2.2250738585072014e-308;
  predicate_23.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.18786","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2cf,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_23);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 4.7455;
  predicate_24.absolute = 2.2250738585072014e-308;
  predicate_24.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","4.7455","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d0,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_24);
  dVar1 = 0.0;
  if ((0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_b0 = filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      uStack_a0 = 0;
      local_a8 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_b0;
      dVar3 = local_a8;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.super_basic_moment<double,_(trial::online::with)3>.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
            filter.super_basic_moment<double,_(trial::online::with)3>.normalization;
  }
  local_c0 = 1.13038;
  predicate_25.absolute = 2.2250738585072014e-308;
  predicate_25.relative = 1e-05;
  local_b8 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.13038","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d1,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_25);
  local_b8 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (filter.sum.kurtosis / (dVar1 * dVar1)) / filter.normalization;
  }
  local_c0 = 1.31835;
  predicate_26.absolute = 2.2250738585072014e-308;
  predicate_26.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.31835","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d2,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_26);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&filter,9.0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 5.86924;
  predicate_27.absolute = 2.2250738585072014e-308;
  predicate_27.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.86924","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d4,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_27);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 6.11216;
  predicate_28.absolute = 2.2250738585072014e-308;
  predicate_28.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","6.11216","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d5,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_28);
  dVar1 = 0.0;
  if ((0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_b0 = filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      uStack_a0 = 0;
      local_a8 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_b0;
      dVar3 = local_a8;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.super_basic_moment<double,_(trial::online::with)3>.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
            filter.super_basic_moment<double,_(trial::online::with)3>.normalization;
  }
  local_c0 = 1.1132;
  predicate_29.absolute = 2.2250738585072014e-308;
  predicate_29.relative = 1e-05;
  local_b8 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.1132","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d6,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_29);
  local_b8 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (filter.sum.kurtosis / (dVar1 * dVar1)) / filter.normalization;
  }
  local_c0 = 1.275;
  predicate_30.absolute = 2.2250738585072014e-308;
  predicate_30.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.275","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d7,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_30);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&filter,10.0);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_c0 = 6.56991;
  predicate_31.absolute = 2.2250738585072014e-308;
  predicate_31.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.56991","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d9,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_31);
  local_b8 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                     super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                            filter.super_basic_moment<double,_(trial::online::with)3>.
                            super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_c0 = 7.60984;
  predicate_32.absolute = 2.2250738585072014e-308;
  predicate_32.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","7.60984","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2da,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_32);
  dVar1 = 0.0;
  if ((0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_b0 = filter.super_basic_moment<double,_(trial::online::with)3>.sum.skewness;
      uStack_a0 = 0;
      local_a8 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_b0;
      dVar3 = local_a8;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.super_basic_moment<double,_(trial::online::with)3>.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) /
            filter.super_basic_moment<double,_(trial::online::with)3>.normalization;
  }
  local_c0 = 1.09832;
  predicate_33.absolute = 2.2250738585072014e-308;
  predicate_33.relative = 1e-05;
  local_b8 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.09832","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2db,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_33);
  local_b8 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar1 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)3>.
                                      super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)3>.
                              super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                             filter.super_basic_moment<double,_(trial::online::with)3>.
                             super_basic_moment<double,_(trial::online::with)2>.normalization)),
     2.220446049250313e-16 < dVar1)) {
    local_b8 = (filter.sum.kurtosis / (dVar1 * dVar1)) / filter.normalization;
  }
  local_c0 = 1.23788;
  predicate_34.absolute = 2.2250738585072014e-308;
  predicate_34.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.23788","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2dc,0x10e972,(char *)&local_b8,&local_c0,in_stack_ffffffffffffff38,
             predicate_34);
  return;
}

Assistant:

void test_linear_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_kurtosis<double> filter(one_over_eight, one_over_four, one_over_four, one_over_four);

    // Cumulative kurtosis converges towards 1.8

    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.124444, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.32288, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.75, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.mean(), 2.08876, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.429707, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.27863, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.69807, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.mean(), 2.66608, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.923291, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.23592, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.59157, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 3.26502, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.60733, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.20177, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.50264, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.mean(), 3.88525, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.47861, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.1738, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.42982, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.mean(), 4.52635, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 3.52889, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.15036, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.36931, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.mean(), 5.18786, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 4.7455, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.13038, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.31835, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.mean(), 5.86924, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 6.11216, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.1132, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.275, tolerance);
    filter.push(10.0);
    TRIAL_TEST_WITH(filter.mean(), 6.56991, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 7.60984, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.09832, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.23788, tolerance);
}